

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

uint8 * Strings::checkUTF8(uint8 *s)

{
  byte *local_18;
  uint8 *s_local;
  
  local_18 = s;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (*local_18 == 0) {
            return (uint8 *)0x0;
          }
          if (0x7f < *local_18) break;
          local_18 = local_18 + 1;
        }
        if ((*local_18 & 0xe0) != 0xc0) break;
        if (((local_18[1] & 0xc0) != 0x80) || ((*local_18 & 0xfe) == 0xc0)) {
          return local_18;
        }
        local_18 = local_18 + 2;
      }
      if ((*local_18 & 0xf0) != 0xe0) break;
      if (((((local_18[1] & 0xc0) != 0x80) || ((local_18[2] & 0xc0) != 0x80)) ||
          ((*local_18 == 0xe0 && ((local_18[1] & 0xe0) == 0x80)))) ||
         (((*local_18 == 0xed && ((local_18[1] & 0xe0) == 0xa0)) ||
          ((*local_18 == 0xef && ((local_18[1] == 0xbf && ((local_18[2] & 0xfe) == 0xbe)))))))) {
        return local_18;
      }
      local_18 = local_18 + 3;
    }
    if ((*local_18 & 0xf8) != 0xf0) {
      return local_18;
    }
    if (((((((local_18[1] & 0xc0) != 0x80) || ((local_18[2] & 0xc0) != 0x80)) ||
          ((local_18[3] & 0xc0) != 0x80)) || ((*local_18 == 0xf0 && ((local_18[1] & 0xf0) == 0x80)))
         ) || ((*local_18 == 0xf4 && (0x8f < local_18[1])))) || (0xf4 < *local_18)) break;
    local_18 = local_18 + 4;
  }
  return local_18;
}

Assistant:

const uint8 * checkUTF8(const uint8 * s)
    {
        while (*s)
        {
            if (*s < 0x80) s++; // Basic ASCII
            else if ((s[0] & 0xE0) == 0xC0)
            { // 110XXXXx 10xxxxxx
                // Could be overlong
                if ((s[1] & 0xC0) != 0x80 || (s[0] & 0xFE) == 0xC0) return s;
                s += 2;
            } else if ((s[0] & 0xF0) == 0xE0)
            { // 1110XXXX 10Xxxxxx 10xxxxxx
                if ((s[1] & 0xC0) != 0x80 || (s[2] & 0xC0) != 0x80 || (s[0] == 0xE0 && (s[1] & 0xE0) == 0x80) // Is overlong?
                ||  (s[0] == 0xED && (s[1] & 0xE0) == 0xA0) // Has surrogate ?
                ||  (s[0] == 0xEF && s[1] == 0xBF && (s[2] & 0xFE) == 0xBE)) // Or invalid code point like FFFE or FFFF
                    return s;
                s += 3;
            } else if ((s[0] & 0xF8) == 0xF0)
            { // 11110XXX 10XXxxxx 10xxxxxx 10xxxxxx
                if ((s[1] & 0xC0) != 0x80 || (s[2] & 0xC0) != 0x80 || (s[3] & 0xC0) != 0x80 || (s[0] == 0xF0 && (s[1] & 0xF0) == 0x80) // Is overlong ?
                ||  (s[0] == 0xF4 && s[1] > 0x8F) || s[0] > 0xF4) // Invalid code point like > 10FFFF
                    return s;
                s += 4;
            }
            else return s; // Invalid sequence anyway for UTF-8
        }
        return 0;
    }